

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number.cpp
# Opt level: O0

Variable __thiscall LiteScript::_Type_NUMBER::Convert(_Type_NUMBER *this,Variable *obj,Type *type)

{
  bool bVar1;
  bool *pbVar2;
  Number *pNVar3;
  Number *this_00;
  String *this_01;
  Object *pOVar4;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  uint *extraout_RDX;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  Variable VVar6;
  Variable local_88 [2];
  String local_68;
  undefined1 local_46;
  undefined1 local_45;
  Number local_44 [3];
  undefined1 local_29;
  Type *local_28;
  Type *type_local;
  Variable *obj_local;
  _Type_NUMBER *this_local;
  Variable *res;
  uint *puVar5;
  
  local_28 = (Type *)CONCAT71(in_register_00000009,in_CL);
  type_local = type;
  obj_local = obj;
  this_local = this;
  bVar1 = Type::operator==(local_28,(Type *)_type_boolean);
  if (bVar1) {
    local_29 = 0;
    pOVar4 = Variable::operator->((Variable *)type_local);
    Memory::Create((Memory *)this,(Type *)pOVar4->memory);
    pOVar4 = Variable::operator->((Variable *)type_local);
    pNVar3 = Object::GetData<LiteScript::Number>(pOVar4);
    Number::Number(local_44,0);
    bVar1 = Number::operator!=(pNVar3,local_44);
    pOVar4 = Variable::operator->((Variable *)this);
    pbVar2 = Object::GetData<bool>(pOVar4);
    *pbVar2 = bVar1;
    puVar5 = extraout_RDX;
  }
  else {
    bVar1 = Type::operator==(local_28,(Type *)_type_number);
    if (bVar1) {
      local_45 = 0;
      pOVar4 = Variable::operator->((Variable *)type_local);
      Memory::Create((Memory *)this,(Type *)pOVar4->memory);
      pOVar4 = Variable::operator->((Variable *)type_local);
      pNVar3 = Object::GetData<LiteScript::Number>(pOVar4);
      pOVar4 = Variable::operator->((Variable *)this);
      this_00 = Object::GetData<LiteScript::Number>(pOVar4);
      Number::operator=(this_00,pNVar3);
      puVar5 = extraout_RDX_00;
    }
    else {
      bVar1 = Type::operator==(local_28,(Type *)_type_string);
      if (bVar1) {
        local_46 = 0;
        pOVar4 = Variable::operator->((Variable *)type_local);
        Memory::Create((Memory *)this,(Type *)pOVar4->memory);
        Variable::operator_cast_to_string(local_88);
        String::String(&local_68,(string *)local_88);
        pOVar4 = Variable::operator->((Variable *)this);
        this_01 = Object::GetData<LiteScript::String>(pOVar4);
        String::operator=(this_01,&local_68);
        String::~String(&local_68);
        std::__cxx11::string::~string((string *)local_88);
        puVar5 = extraout_RDX_01;
      }
      else {
        pOVar4 = Variable::operator->((Variable *)type_local);
        VVar6 = Memory::Create((Memory *)this,(Type *)pOVar4->memory);
        puVar5 = VVar6.nb_ref;
      }
    }
  }
  VVar6.nb_ref = puVar5;
  VVar6.obj = (Object *)this;
  return VVar6;
}

Assistant:

LiteScript::Variable LiteScript::_Type_NUMBER::Convert(const LiteScript::Variable& obj, const LiteScript::Type& type) const {
    if (type == Type::BOOLEAN) {
        Variable res = obj->memory.Create(Type::BOOLEAN);
        res->GetData<bool>() = (obj->GetData<Number>() != Number(0));
        return res;
    }
    else if (type == Type::NUMBER) {
        Variable res = obj->memory.Create(Type::NUMBER);
        res->GetData<Number>() = obj->GetData<Number>();
        return res;
    }
    else if (type == Type::STRING) {
        Variable res = obj->memory.Create(Type::STRING);
        res->GetData<String>() = String(obj);
        return res;
    }
    else {
        return obj->memory.Create(Type::NIL);
    }
}